

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O0

void test_large_deflate(Byte *compr,uLong comprLen,Byte *uncompr,uLong uncomprLen)

{
  uint uVar1;
  int iVar2;
  Byte *pBStack_98;
  int err;
  z_stream c_stream;
  uLong uncomprLen_local;
  Byte *uncompr_local;
  uLong comprLen_local;
  Byte *compr_local;
  
  c_stream.state = (internal_state *)zalloc;
  c_stream.zalloc = (alloc_func)zfree;
  c_stream.zfree = (free_func)0x0;
  c_stream.reserved = uncomprLen;
  uVar1 = deflateInit_(&stack0xffffffffffffff68,1,"1.2.8",0x70);
  if (uVar1 != 0) {
    fprintf(_stderr,"%s error: %d\n","deflateInit",(ulong)uVar1);
    exit(1);
  }
  c_stream.next_out._0_4_ = (undefined4)comprLen;
  c_stream.next_in._0_4_ = (uint)c_stream.reserved;
  pBStack_98 = uncompr;
  c_stream.total_in = (uLong)compr;
  uVar1 = deflate(&stack0xffffffffffffff68,0);
  if (uVar1 != 0) {
    fprintf(_stderr,"%s error: %d\n","deflate",(ulong)uVar1);
    exit(1);
  }
  if ((uint)c_stream.next_in != 0) {
    fprintf(_stderr,"deflate not greedy\n");
    exit(1);
  }
  deflateParams(&stack0xffffffffffffff68,0);
  c_stream.next_in._0_4_ = (uint)(comprLen >> 1) & 0x7fffffff;
  pBStack_98 = compr;
  uVar1 = deflate(&stack0xffffffffffffff68,0);
  if (uVar1 != 0) {
    fprintf(_stderr,"%s error: %d\n","deflate",(ulong)uVar1);
    exit(1);
  }
  deflateParams(&stack0xffffffffffffff68,9,1);
  c_stream.next_in._0_4_ = (uint)c_stream.reserved;
  pBStack_98 = uncompr;
  uVar1 = deflate(&stack0xffffffffffffff68,0);
  if (uVar1 != 0) {
    fprintf(_stderr,"%s error: %d\n","deflate",(ulong)uVar1);
    exit(1);
  }
  iVar2 = deflate(&stack0xffffffffffffff68,4);
  if (iVar2 != 1) {
    fprintf(_stderr,"deflate should report Z_STREAM_END\n");
    exit(1);
  }
  uVar1 = deflateEnd(&stack0xffffffffffffff68);
  if (uVar1 != 0) {
    fprintf(_stderr,"%s error: %d\n","deflateEnd",(ulong)uVar1);
    exit(1);
  }
  return;
}

Assistant:

void test_large_deflate(compr, comprLen, uncompr, uncomprLen)
    Byte *compr, *uncompr;
    uLong comprLen, uncomprLen;
{
    z_stream c_stream; /* compression stream */
    int err;

    c_stream.zalloc = zalloc;
    c_stream.zfree = zfree;
    c_stream.opaque = (voidpf)0;

    err = deflateInit(&c_stream, Z_BEST_SPEED);
    CHECK_ERR(err, "deflateInit");

    c_stream.next_out = compr;
    c_stream.avail_out = (uInt)comprLen;

    /* At this point, uncompr is still mostly zeroes, so it should compress
     * very well:
     */
    c_stream.next_in = uncompr;
    c_stream.avail_in = (uInt)uncomprLen;
    err = deflate(&c_stream, Z_NO_FLUSH);
    CHECK_ERR(err, "deflate");
    if (c_stream.avail_in != 0) {
        fprintf(stderr, "deflate not greedy\n");
        exit(1);
    }

    /* Feed in already compressed data and switch to no compression: */
    deflateParams(&c_stream, Z_NO_COMPRESSION, Z_DEFAULT_STRATEGY);
    c_stream.next_in = compr;
    c_stream.avail_in = (uInt)comprLen/2;
    err = deflate(&c_stream, Z_NO_FLUSH);
    CHECK_ERR(err, "deflate");

    /* Switch back to compressing mode: */
    deflateParams(&c_stream, Z_BEST_COMPRESSION, Z_FILTERED);
    c_stream.next_in = uncompr;
    c_stream.avail_in = (uInt)uncomprLen;
    err = deflate(&c_stream, Z_NO_FLUSH);
    CHECK_ERR(err, "deflate");

    err = deflate(&c_stream, Z_FINISH);
    if (err != Z_STREAM_END) {
        fprintf(stderr, "deflate should report Z_STREAM_END\n");
        exit(1);
    }
    err = deflateEnd(&c_stream);
    CHECK_ERR(err, "deflateEnd");
}